

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::deactivate(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *this,timer_object_holder<timertt::thread_safety::unsafe> *timer)

{
  size_t *psVar1;
  int iVar2;
  timer_type *ptVar3;
  timer_type *ptVar4;
  timer_type *t;
  timer_type **pptVar5;
  timer_type **pptVar6;
  
  t = timer_object_holder<timertt::thread_safety::unsafe>::
      cast_to<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                (timer);
  iVar2 = *(int *)&(t->super_timer_object<timertt::thread_safety::unsafe>).field_0xc;
  if (iVar2 == 2) {
    *(undefined4 *)&(t->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 3;
  }
  else if (iVar2 == 1) {
    ptVar3 = t->m_prev;
    ptVar4 = t->m_next;
    pptVar5 = &ptVar3->m_next;
    if (ptVar3 == (timer_type *)0x0) {
      pptVar5 = &this->m_head;
    }
    pptVar6 = &ptVar4->m_prev;
    if (ptVar4 == (timer_type *)0x0) {
      pptVar6 = &this->m_tail;
    }
    *pptVar5 = ptVar4;
    *pptVar6 = ptVar3;
    psVar1 = &(this->
              super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              ).m_timer_quantities.m_single_shot_count + ((t->m_period).__r != 0);
    *psVar1 = *psVar1 - 1;
    *(undefined4 *)&(t->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
    timer_object<timertt::thread_safety::unsafe>::decrement_references
              (&t->super_timer_object<timertt::thread_safety::unsafe>);
    return;
  }
  return;
}

Assistant:

void
	deactivate(
		//! Timer to be deactivated.
		timer_object_holder< THREAD_SAFETY > timer )
	{
		auto list_timer = timer.template cast_to< timer_type >();
		if( timer_status::active == list_timer->m_status )
		{
			// This is normal active timer. It can be safely
			// deactivated and destroyed.
			remove_timer_from_list( list_timer );
			// Count of timers in the list changed.
			this->dec_timer_count( list_timer->kind() );

			list_timer->m_status = timer_status::deactivated;

			// Release timer object.
			timer_object< THREAD_SAFETY >::decrement_references( list_timer );
		}
		else if( timer_status::wait_for_execution == list_timer->m_status )
		{
			// This timer is in execution list right now.
			// We can only change its status.
			// Final deactivation will be done after execution of
			// timers actions.
			list_timer->m_status = timer_status::wait_for_deactivation;
		}
	}